

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_strex.cc
# Opt level: O3

int ASN1_GENERALIZEDTIME_print(BIO *fp,ASN1_GENERALIZEDTIME *a)

{
  int iVar1;
  uint uVar2;
  tm utc;
  CBS cbs;
  
  cbs.data = a->data;
  cbs.len = (size_t)a->length;
  uVar2 = 0;
  iVar1 = CBS_parse_generalized_time(&cbs,&utc,0);
  if (iVar1 == 0) {
    BIO_puts(fp,"Bad time value");
  }
  else {
    iVar1 = BIO_printf(fp,"%s %2d %02d:%02d:%02d %d GMT",mon[utc.tm_mon],(ulong)(uint)utc.tm_mday,
                       (ulong)(uint)utc.tm_hour,(ulong)(uint)utc.tm_min,(ulong)(uint)utc.tm_sec,
                       (ulong)(utc.tm_year + 0x76c));
    uVar2 = (uint)(0 < iVar1);
  }
  return uVar2;
}

Assistant:

int ASN1_GENERALIZEDTIME_print(BIO *bp, const ASN1_GENERALIZEDTIME *tm) {
  CBS cbs;
  CBS_init(&cbs, tm->data, tm->length);
  struct tm utc;
  if (!CBS_parse_generalized_time(&cbs, &utc, /*allow_timezone_offset=*/0)) {
    BIO_puts(bp, "Bad time value");
    return 0;
  }

  return BIO_printf(bp, "%s %2d %02d:%02d:%02d %d GMT", mon[utc.tm_mon],
                    utc.tm_mday, utc.tm_hour, utc.tm_min, utc.tm_sec,
                    utc.tm_year + 1900) > 0;
}